

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallPtrSet.h
# Opt level: O2

pair<const_void_*const_*,_bool> __thiscall
llvm::SmallPtrSetImplBase::insert_imp(SmallPtrSetImplBase *this,void *Ptr)

{
  uint uVar1;
  void **ppvVar2;
  pair<const_void_*const_*,_bool> pVar3;
  pair<const_void_*const_*,_bool> pVar4;
  void **ppvVar5;
  ulong uVar6;
  undefined7 uVar7;
  void **ppvVar8;
  long lVar9;
  pair<const_void_*const_*,_bool> pVar10;
  
  ppvVar2 = this->SmallArray;
  if (this->CurArray == ppvVar2) {
    uVar1 = this->NumNonEmpty;
    uVar6 = (ulong)uVar1;
    ppvVar8 = (void **)0x0;
    ppvVar5 = ppvVar2;
    for (lVar9 = uVar6 * 8; lVar9 != 0; lVar9 = lVar9 + -8) {
      if (*ppvVar5 == Ptr) {
        pVar10._8_8_ = 0;
        pVar10.first = ppvVar5;
        return pVar10;
      }
      if (*ppvVar5 == (void *)0xfffffffffffffffe) {
        ppvVar8 = ppvVar5;
      }
      ppvVar5 = ppvVar5 + 1;
    }
    uVar7 = (undefined7)((ulong)ppvVar2 >> 8);
    if (ppvVar8 != (void **)0x0) {
      *ppvVar8 = Ptr;
      this->NumTombstones = this->NumTombstones - 1;
      pVar3._9_7_ = uVar7;
      pVar3.second = true;
      pVar3.first = ppvVar8;
      return pVar3;
    }
    if (uVar1 < this->CurArraySize) {
      this->NumNonEmpty = uVar1 + 1;
      ppvVar2[uVar6] = Ptr;
      pVar4._9_7_ = uVar7;
      pVar4.second = true;
      pVar4.first = this->SmallArray + uVar6;
      return pVar4;
    }
  }
  pVar10 = insert_imp_big(this,Ptr);
  return pVar10;
}

Assistant:

std::pair<const void *const *, bool> insert_imp(const void *Ptr) {
    if (isSmall()) {
      // Check to see if it is already in the set.
      const void **LastTombstone = nullptr;
      for (const void **APtr = SmallArray, **E = SmallArray + NumNonEmpty;
           APtr != E; ++APtr) {
        const void *Value = *APtr;
        if (Value == Ptr)
          return std::make_pair(APtr, false);
        if (Value == getTombstoneMarker())
          LastTombstone = APtr;
      }

      // Did we find any tombstone marker?
      if (LastTombstone != nullptr) {
        *LastTombstone = Ptr;
        --NumTombstones;
        incrementEpoch();
        return std::make_pair(LastTombstone, true);
      }

      // Nope, there isn't.  If we stay small, just 'pushback' now.
      if (NumNonEmpty < CurArraySize) {
        SmallArray[NumNonEmpty++] = Ptr;
        incrementEpoch();
        return std::make_pair(SmallArray + (NumNonEmpty - 1), true);
      }
      // Otherwise, hit the big set case, which will call grow.
    }
    return insert_imp_big(Ptr);
  }